

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

UndefValue * __thiscall
LLVMBC::LLVMContext::construct<LLVMBC::UndefValue,LLVMBC::Type*&>(LLVMContext *this,Type **u)

{
  UndefValue *this_00;
  UndefValue *t;
  UndefValue *mem;
  Type **u_local;
  LLVMContext *this_local;
  
  this_00 = (UndefValue *)allocate(this,0x38,8);
  if (this_00 == (UndefValue *)0x0) {
    std::terminate();
  }
  UndefValue::UndefValue(this_00,*u);
  return this_00;
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}